

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_CallAsmInternalCommon
          (InterpreterStackFrame *this,ScriptFunction *function,RegSlot returnReg)

{
  ScriptContext *scriptContext;
  _func_void_ptr_RecyclableObject_ptr_CallInfo____ *p_Var1;
  code *pcVar2;
  InterpreterStackFrame *this_00;
  bool bVar3;
  Which WVar4;
  int iVar5;
  AsmJsScriptFunction *this_01;
  FunctionBody *this_02;
  AsmJsFunctionInfo *pAVar6;
  ProxyEntryPointInfo *pPVar7;
  long lVar8;
  undefined4 *puVar9;
  uint uVar10;
  float fVar11;
  double dVar12;
  AsmJsRetType local_44;
  InterpreterStackFrame *local_40;
  RegSlot local_34;
  
  local_40 = this;
  local_34 = returnReg;
  this_01 = VarTo<Js::AsmJsScriptFunction,Js::ScriptFunction>(function);
  this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_01);
  pAVar6 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                     ((FunctionProxy *)this_02);
  uVar10 = pAVar6->mArgByteSize + 0xf & 0xfffffff0;
  scriptContext =
       (((((function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  pPVar7 = ScriptFunction::GetEntryPointInfo(function);
  ThreadContext::ProbeStack
            (scriptContext->threadContext,(ulong)uVar10 + 0xc00,(RecyclableObject *)function,
             scriptContext);
  this_00 = local_40;
  p_Var1 = (_func_void_ptr_RecyclableObject_ptr_CallInfo____ *)pPVar7->jsMethod;
  local_44.which_ = (pAVar6->mReturnType).which_;
  WVar4 = AsmJsRetType::which(&local_44);
  switch(WVar4) {
  case Int64:
    lVar8 = JavascriptFunction::CallAsmJsFunction<long>
                      ((RecyclableObject *)function,p_Var1,*(void ***)(this_00 + 0x28),uVar10,
                       (uchar *)0x0);
    *(long *)(*(long *)(this_00 + 0x120) + (ulong)local_34 * 8) = lVar8;
    break;
  case Double:
    dVar12 = JavascriptFunction::CallAsmJsFunction<double>
                       ((RecyclableObject *)function,p_Var1,*(void ***)(this_00 + 0x28),uVar10,
                        (uchar *)0x0);
    *(double *)(*(long *)(this_00 + 0x128) + (ulong)local_34 * 8) = dVar12;
    break;
  case Float:
    fVar11 = JavascriptFunction::CallAsmJsFunction<float>
                       ((RecyclableObject *)function,p_Var1,*(void ***)(this_00 + 0x28),uVar10,
                        (uchar *)0x0);
    *(float *)(*(long *)(this_00 + 0x130) + (ulong)local_34 * 4) = fVar11;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xf34,"((0))","(0)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
    break;
  case Signed:
    iVar5 = JavascriptFunction::CallAsmJsFunction<int>
                      ((RecyclableObject *)function,p_Var1,*(void ***)(this_00 + 0x28),uVar10,
                       (uchar *)0x0);
    *(int *)(*(long *)(this_00 + 0x118) + (ulong)local_34 * 4) = iVar5;
    break;
  case Void:
    JavascriptFunction::CallAsmJsFunction<int>
              ((RecyclableObject *)function,p_Var1,*(void ***)(this_00 + 0x28),uVar10,(uchar *)0x0);
    break;
  case Int32x4:
  case Uint32x4:
  case Int16x8:
  case Int8x16:
  case Uint16x8:
  case Uint8x16:
  case Bool32x4:
  case Bool16x8:
  case Bool8x16:
  case Float32x4:
  case Float64x2:
    break;
  }
  PopOut(this_00,(pAVar6->mArgByteSize >> 3) + 1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_CallAsmInternalCommon(ScriptFunction* function, RegSlot returnReg)
    {
        AsmJsScriptFunction* scriptFunc = VarTo<AsmJsScriptFunction>(function);
        AsmJsFunctionInfo* asmInfo = scriptFunc->GetFunctionBody()->GetAsmJsFunctionInfo();
        uint alignedArgsSize = ::Math::Align<uint32>(asmInfo->GetArgByteSize(), 16);
#if _M_X64 && _WIN32
        // convention is to always allocate spill space for rcx,rdx,r8,r9
        if (alignedArgsSize < 0x20) alignedArgsSize = 0x20;
        uint* argSizes = asmInfo->GetArgsSizesArray();
        Assert(asmInfo->GetArgSizeArrayLength() >= 2);
        byte* curOutParams = (byte*)m_outParams + sizeof(Var);
        Assert(curOutParams + argSizes[0] + argSizes[1] + 16 <= (byte*)this->m_outParamsEnd);

        // Prepare in advance the possible arguments that will need to be put in register
        byte _declspec(align(16)) reg[3 * 16];
        CompileAssert((FunctionBody::MinAsmJsOutParams() * sizeof(Var)) == (sizeof(Var) * 2 + sizeof(reg)));
        js_memcpy_s(reg, 16, curOutParams, 16);
        js_memcpy_s(reg + 16, 16, curOutParams + argSizes[0], 16);
        js_memcpy_s(reg + 32, 16, curOutParams + argSizes[0] + argSizes[1], 16);
#else
        byte* reg = nullptr;
#endif

        ScriptContext * scriptContext = function->GetScriptContext();
        Js::FunctionEntryPointInfo* entrypointInfo = (Js::FunctionEntryPointInfo*)function->GetEntryPointInfo();
        PROBE_STACK_CALL(scriptContext, function, alignedArgsSize + Js::Constants::MinStackDefault);
        // Calling the jsMethod might change the entrypoint, adding the variable here 
        // will save the method on the stack helping debug what really got called
        JavascriptMethod jsMethod = entrypointInfo->jsMethod;

        switch (asmInfo->GetReturnType().which())
        {
        case AsmJsRetType::Void:
            JavascriptFunction::CallAsmJsFunction<int>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Signed:

            m_localIntSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<int>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Int64:
            m_localInt64Slots[returnReg] = JavascriptFunction::CallAsmJsFunction<int64>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Double:
            m_localDoubleSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<double>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Float:
            m_localFloatSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<float>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
#ifdef ENABLE_WASM_SIMD
        case AsmJsRetType::Float32x4:
        case AsmJsRetType::Int32x4:
        case AsmJsRetType::Bool32x4:
        case AsmJsRetType::Bool16x8:
        case AsmJsRetType::Bool8x16:
        case AsmJsRetType::Float64x2:
        case AsmJsRetType::Int16x8:
        case AsmJsRetType::Int8x16:
        case AsmJsRetType::Uint32x4:
        case AsmJsRetType::Uint16x8:
        case AsmJsRetType::Uint8x16:
#if _WIN32 //WASM.SIMD ToDo: Enable thunk for Xplat
#if _M_X64
#if !defined(__clang__)
            X86SIMDValue simdVal;
            simdVal.m128_value = JavascriptFunction::CallAsmJsFunction<__m128>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            m_localSimdSlots[returnReg] = X86SIMDValue::ToSIMDValue(simdVal);
#else
            AssertOrFailFastMsg(false, "This particular path causes linking issues in clang on windows; potential difference in name mangling?");
#endif // !defined(__clang__)
#else
            m_localSimdSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<AsmJsSIMDValue>(function, jsMethod, m_outParams, alignedArgsSize, reg);
#endif // _M_X64
#endif // _WIN32
            break;
#endif // ENABLE_WASM_SIMD
        default:
            Assume(UNREACHED);
        }

        const ArgSlot nVarToPop = (asmInfo->GetArgByteSize() / sizeof(Var)) + 1;
        PopOut(nVarToPop);

        Assert(function);
    }